

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportBuildFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *param_3)

{
  cmMakefile *this_00;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  string *psVar6;
  pointer config;
  string *psVar7;
  pointer pbVar8;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view str;
  string_view separator;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  char local_2a9;
  string *local_2a8;
  cmGeneratorTarget *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  cmAlphaNum local_218;
  string dest;
  string local_1c8;
  ostringstream e;
  
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0 = gte;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,gte->Makefile,IncludeEmptyConfig);
  local_2a8 = __return_storage_ptr__;
  cmFileSet::CompileDirectoryEntries(&directoryEntries,fileSet);
  pbVar2 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  config = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar7 = local_2a8;
    if (config == pbVar2) {
      separator._M_str = " ";
      separator._M_len = 1;
      cmJoin(local_2a8,&resultVector,separator,(string_view)ZEXT816(0));
LAB_002922d9:
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&directoryEntries);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&configs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&resultVector);
      return psVar7;
    }
    psVar7 = config;
    cmFileSet::EvaluateDirectoryEntries
              (&directories,fileSet,&directoryEntries,local_2a0->LocalGenerator,config,local_2a0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    bVar3 = std::
            any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>*,std::vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>>,bool(*)(std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>const&)>
                      ((__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                        )directoryEntries.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                        )directoryEntries.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       anon_unknown.dwarf_bc6231::EntryIsContextSensitive);
    pbVar8 = directories.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = directories.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((bVar3) &&
       ((__y._M_str = "CXX_MODULES", __y._M_len = 0xb, __x._M_str = (fileSet->Type)._M_dataplus._M_p
        , __x._M_len = (fileSet->Type)._M_string_length, bVar4 = std::operator==(__x,__y), bVar4 ||
        (__y_00._M_str = "CXX_MODULE_HEADER_UNITS", __y_00._M_len = 0x17,
        __x_00._M_str = (fileSet->Type)._M_dataplus._M_p,
        __x_00._M_len = (fileSet->Type)._M_string_length, bVar4 = std::operator==(__x_00,__y_00),
        pbVar8 = directories.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        pbVar1 = directories.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, bVar4)))) {
      this_00 = this->LG->Makefile;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,"The \"");
      psVar7 = local_2a8;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_2a0);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\" target\'s interface file set \"");
      poVar5 = std::operator<<(poVar5,(string *)fileSet);
      poVar5 = std::operator<<(poVar5,"\" of type \"");
      poVar5 = std::operator<<(poVar5,(string *)&fileSet->Type);
      std::operator<<(poVar5,
                      "\" contains context-sensitive base directory entries which is not supported."
                     );
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
      psVar7->_M_string_length = 0;
      (psVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&directories);
      goto LAB_002922d9;
    }
    for (; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1) {
      str._M_str = (char *)0x1;
      str._M_len = (size_t)(pbVar8->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&dest,(cmOutputConverter *)pbVar8->_M_string_length,str,(WrapQuotes)psVar7);
      if ((!bVar3) ||
         ((long)configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20)) {
        _e = 1;
        local_218.View_._M_len = dest._M_string_length;
        local_218.View_._M_str = dest._M_dataplus._M_p;
        local_2a9 = '\"';
        cmStrCat<char>(&local_1c8,(cmAlphaNum *)&e,&local_218,&local_2a9);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &resultVector,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&dest);
        break;
      }
      _e = 0xc;
      local_218.View_._M_str = (config->_M_dataplus)._M_p;
      local_218.View_._M_len = config->_M_string_length;
      psVar7 = &dest;
      cmStrCat<char[3],std::__cxx11::string,char[3]>
                (&local_1c8,(cmAlphaNum *)&e,&local_218,(char (*) [3])">:",&dest,(char (*) [3])">\""
                );
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&resultVector,
                 &local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&dest);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&directories);
    config = config + 1;
  } while( true );
}

Assistant:

std::string cmExportBuildFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* /*te*/)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    bool const contextSensitive =
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->LG->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base directory entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& directory : directories) {
      auto dest = cmOutputConverter::EscapeForCMake(
        directory, cmOutputConverter::WrapQuotes::NoWrap);

      if (contextSensitive && configs.size() != 1) {
        resultVector.push_back(
          cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
      } else {
        resultVector.push_back(cmStrCat('"', dest, '"'));
        break;
      }
    }
  }

  return cmJoin(resultVector, " ");
}